

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O1

size_t Col_StringBufferCapacity(Col_Word strbuf)

{
  uint uVar1;
  
  if (strbuf == 0) {
    uVar1 = 0;
  }
  else if ((strbuf & 0xf) == 0) {
    uVar1 = -(uint)((*(byte *)strbuf & 2) == 0) | *(byte *)strbuf & 0xfffffffe;
  }
  else {
    uVar1 = immediateWordTypes[(uint)strbuf & 0x1f];
  }
  if ((uVar1 == 2) && ((*(byte *)(strbuf + 2) & 0xc) == 0)) {
    strbuf = *(Col_Word *)(strbuf + 0x10);
  }
  return ((ulong)*(ushort *)(strbuf + 2) * 0x20 - 0x18) / (ulong)(*(byte *)(strbuf + 1) & 7);
}

Assistant:

size_t
Col_StringBufferCapacity(
    Col_Word strbuf)    /*!< String buffer to get capacity for. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return 0;

    WORD_UNWRAP(strbuf);

    return STRBUF_MAX_LENGTH(WORD_STRBUF_SIZE(strbuf) * CELL_SIZE,
            WORD_STRBUF_FORMAT(strbuf));
}